

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifinpdlg(bifcxdef *ctx,int argc)

{
  int iVar1;
  uint id_00;
  int iVar2;
  size_t sVar3;
  long lVar4;
  long in_RDI;
  int resid;
  int id;
  int icon_id;
  int std_btns;
  int resp;
  int cancel_resp;
  int default_resp;
  size_t bcnt;
  uint len;
  char *xp;
  char *dst;
  char *labels [10];
  char lblbuf [256];
  char prompt [256];
  uchar *p;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  runcxdef *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  runcxdef *in_stack_fffffffffffffd30;
  uchar *in_stack_fffffffffffffd38;
  uchar *str;
  size_t in_stack_fffffffffffffd40;
  uchar *buf;
  bifcxdef *ctx_00;
  int local_2a4;
  ulong local_288;
  byte *local_278;
  byte *local_270;
  undefined8 local_268 [10];
  byte local_218 [136];
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  char **in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffea0;
  byte local_118 [256];
  uchar *local_18;
  long local_8;
  
  lVar4 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar4 + -0x10;
  if (*(char *)(lVar4 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
  }
  ctx_00 = *(bifcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar4 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar4 + -0x10;
  if (*(char *)(lVar4 + -0x10) != '\x03') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
  }
  buf = *(uchar **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  local_18 = buf;
  local_8 = in_RDI;
  bifcstr(ctx_00,(char *)buf,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  for (local_278 = local_118; *local_278 != 0; local_278 = local_278 + 1) {
    *local_278 = G_cmap_output[*local_278];
  }
  if (*(char *)(*(long *)(*(long *)(local_8 + 8) + 0x20) + -0x10) == '\x01') {
    lVar4 = *(long *)(*(long *)(local_8 + 8) + 0x20);
    *(long *)(*(long *)(local_8 + 8) + 0x20) = lVar4 + -0x10;
    if (*(char *)(lVar4 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(local_8 + 8) + 0x68) = 0;
      runsign(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
    }
  }
  else {
    lVar4 = *(long *)(*(long *)(local_8 + 8) + 0x20);
    *(long *)(*(long *)(local_8 + 8) + 0x20) = lVar4 + -0x10;
    if (*(char *)(lVar4 + -0x10) != '\a') {
      *(undefined4 *)(*(long *)**(undefined8 **)(local_8 + 8) + 0x68) = 0;
      runsign(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
    }
    str = *(uchar **)(*(long *)(*(long *)(local_8 + 8) + 0x20) + 8);
    local_18 = str;
    iVar1 = osrp2(str);
    local_18 = local_18 + 2;
    local_288 = 0;
    local_270 = local_218;
    while (iVar1 != 0) {
      if (*local_18 == '\x03') {
        bifcstr(ctx_00,(char *)buf,in_stack_fffffffffffffd40,str);
        for (local_278 = local_270; *local_278 != 0; local_278 = local_278 + 1) {
          *local_278 = G_cmap_output[*local_278];
        }
        local_268[local_288] = local_270;
        sVar3 = strlen((char *)local_270);
        local_270 = local_270 + sVar3 + 1;
        local_288 = local_288 + 1;
      }
      else if (*local_18 == '\x01') {
        lVar4 = osrp4s(local_18 + 1);
        id_00 = (int)lVar4 - 1;
        in_stack_fffffffffffffd30 = (runcxdef *)(ulong)id_00;
        switch(in_stack_fffffffffffffd30) {
        case (runcxdef *)0x0:
          local_2a4 = 1;
          break;
        case (runcxdef *)0x1:
          local_2a4 = 2;
          break;
        case (runcxdef *)0x2:
          local_2a4 = 3;
          break;
        case (runcxdef *)0x3:
          local_2a4 = 4;
          break;
        default:
          local_2a4 = 0;
        }
        if ((local_2a4 != 0) &&
           (iVar2 = os_get_str_rsc(id_00,in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20
                                  ), iVar2 == 0)) {
          local_268[local_288] = local_270;
          sVar3 = strlen((char *)local_270);
          local_270 = local_270 + sVar3 + 1;
          local_288 = local_288 + 1;
        }
      }
      if ((9 < local_288) || (local_118 <= local_270)) break;
      lstadv((uchar **)in_stack_fffffffffffffd20,
             (uint *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    }
  }
  if (*(char *)(*(long *)(*(long *)(local_8 + 8) + 0x20) + -0x10) == '\x05') {
    *(long *)(*(long *)(local_8 + 8) + 0x20) = *(long *)(*(long *)(local_8 + 8) + 0x20) + -0x10;
  }
  else {
    lVar4 = *(long *)(*(long *)(local_8 + 8) + 0x20);
    *(long *)(*(long *)(local_8 + 8) + 0x20) = lVar4 + -0x10;
    if (*(char *)(lVar4 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(local_8 + 8) + 0x68) = 0;
      runsign(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
    }
    in_stack_fffffffffffffd28 = *(char **)(*(long *)(*(long *)(local_8 + 8) + 0x20) + 8);
  }
  if (*(char *)(*(long *)(*(long *)(local_8 + 8) + 0x20) + -0x10) == '\x05') {
    *(long *)(*(long *)(local_8 + 8) + 0x20) = *(long *)(*(long *)(local_8 + 8) + 0x20) + -0x10;
  }
  else {
    lVar4 = *(long *)(*(long *)(local_8 + 8) + 0x20);
    *(long *)(*(long *)(local_8 + 8) + 0x20) = lVar4 + -0x10;
    if (*(char *)(lVar4 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(local_8 + 8) + 0x68) = 0;
      runsign(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
    }
  }
  outflushn(0);
  tio_input_dialog(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
                   in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,
                   in_stack_fffffffffffffea0);
  runpnum(in_stack_fffffffffffffd30,(long)in_stack_fffffffffffffd28);
  return;
}

Assistant:

void bifinpdlg(bifcxdef *ctx, int argc)
{
    uchar *p;
    char prompt[256];
    char lblbuf[256];
    char *labels[10];
    char *dst;
    char *xp;
    uint len;
    size_t bcnt;
    int default_resp, cancel_resp;
    int resp;
    int std_btns;
    int icon_id;

    /* check for proper arguments */
    bifcntargs(ctx, 5, argc);

    /* get the icon number */
    icon_id = runpopnum(ctx->bifcxrun);

    /* get the prompt string */
    p = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, prompt, (size_t)sizeof(prompt), p);

    /* translate from internal to local characters */
    for (xp = prompt ; *xp != '\0' ; xp++)
        *xp = (char)cmap_i2n(*xp);

    /* check for a standard button set selection */
    if (runtostyp(ctx->bifcxrun) == DAT_NUMBER)
    {
        /* get the standard button set ID */
        std_btns = runpopnum(ctx->bifcxrun);

        /* there are no actual buttons */
        bcnt = 0;
    }
    else
    {
        /* we're not using standard buttons */
        std_btns = 0;
        
        /* get the response string list */
        p = runpoplst(ctx->bifcxrun);
        len = osrp2(p);
        p += 2;
        
        /* build our internal button list */
        for (bcnt = 0, dst = lblbuf ; len != 0 ; lstadv(&p, &len))
        {
            /* see what we have */
            if (*p == DAT_SSTRING)
            {
                /* it's a label string - convert to a C string */
                bifcstr(ctx, dst, sizeof(lblbuf) - (dst - lblbuf), p + 1);

                /* translate from internal to local characters */
                for (xp = dst ; *xp != '\0' ; xp++)
                    *xp = (char)cmap_i2n(*xp);
                
                /* set this button to point to the converted text */
                labels[bcnt++] = dst;
                
                /* move past this label in the button buffer */
                dst += strlen(dst) + 1;
            }
            else if (*p == DAT_NUMBER)
            {
                int id;
                int resid;
                
                /* it's a standard system label ID - get the ID */
                id = (int)osrp4s(p + 1);

                /* translate it to the appropriate string resource */
                switch(id)
                {
                case BIFINPDLG_LBL_OK:
                    resid = RESID_BTN_OK;
                    break;
                    
                case BIFINPDLG_LBL_CANCEL:
                    resid = RESID_BTN_CANCEL;
                    break;
                    
                case BIFINPDLG_LBL_YES:
                    resid = RESID_BTN_YES;
                    break;
                    
                case BIFINPDLG_LBL_NO:
                    resid = RESID_BTN_NO;
                    break;

                default:
                    resid = 0;
                    break;
                }

                /* 
                 *   if we got a valid resource ID, load the resource;
                 *   otherwise, skip this button
                 */
                if (resid != 0
                    && !os_get_str_rsc(resid, dst,
                                       sizeof(lblbuf) - (dst - lblbuf)))
                {
                    /* set this button to point to the converted text */
                    labels[bcnt++] = dst;

                    /* move past this label in the button buffer */
                    dst += strlen(dst) + 1;
                }
            }
            
            /* if we have exhausted our label array, stop now */
            if (bcnt >= sizeof(labels)/sizeof(labels[0])
                || dst >= lblbuf + sizeof(lblbuf))
                break;
        }
    }

    /* get the default response */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        default_resp = 0;
    }
    else
        default_resp = runpopnum(ctx->bifcxrun);

    /* get the cancel response */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        cancel_resp = 0;
    }
    else
        cancel_resp = runpopnum(ctx->bifcxrun);

    /* flush output before showing the dialog */
    tioflushn(ctx->bifcxtio, 0);

    /* show the dialog */
    resp = tio_input_dialog(icon_id, prompt, std_btns,
                            (const char **)labels, bcnt,
                            default_resp, cancel_resp);

    /* return the result */
    runpnum(ctx->bifcxrun, resp);
}